

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::ReadWriteMemTask::checkArguments
          (ReadWriteMemTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Scope *pSVar1;
  Compilation *pCVar2;
  bool bVar3;
  Type *pTVar4;
  Type *pTVar5;
  Diagnostic *this_00;
  ulong uVar6;
  char *func;
  Expression *arg;
  
  pSVar1 = (context->scope).ptr;
  if (pSVar1 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
    goto LAB_00399795;
  }
  pCVar2 = pSVar1->compilation;
  bVar3 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,2,4);
  if (!bVar3) {
LAB_00399734:
    return pCVar2->errorType;
  }
  if ((this->super_SystemTaskBase).super_SystemSubroutine.field_0x34 == '\x01') {
    if (args->size_ < 2) goto LAB_00399764;
    bVar3 = Expression::requireLValue
                      (args->data_[1],context,(SourceLocation)0x0,
                       (bitmask<slang::ast::AssignFlags>)0x0,(Expression *)0x0,(EvalContext *)0x0);
    if (!bVar3) goto LAB_00399734;
  }
  if (args->size_ == 0) goto LAB_00399764;
  pTVar5 = ((*args->data_)->type).ptr;
  if (pTVar5 != (Type *)0x0) {
    bVar3 = Type::canBeStringLike(pTVar5);
    if (!bVar3) {
      if (args->size_ != 0) {
        arg = *args->data_;
        goto LAB_003996ee;
      }
      goto LAB_00399764;
    }
    if (args->size_ < 2) goto LAB_00399764;
    pTVar5 = (args->data_[1]->type).ptr;
    if (pTVar5 != (Type *)0x0) {
      bVar3 = Type::isUnpackedArray(pTVar5);
      uVar6 = args->size_;
      if (!bVar3) {
LAB_003996e1:
        if (1 < uVar6) {
          arg = args->data_[1];
LAB_003996ee:
          pTVar5 = SystemSubroutine::badArg((SystemSubroutine *)this,context,arg);
          return pTVar5;
        }
LAB_00399764:
        std::terminate();
      }
      if (uVar6 < 2) goto LAB_00399764;
      pTVar5 = (args->data_[1]->type).ptr;
      if (pTVar5 != (Type *)0x0) {
        do {
          pTVar4 = pTVar5->canonical;
          if (pTVar4 == (Type *)0x0) {
            Type::resolveCanonical(pTVar5);
            pTVar4 = pTVar5->canonical;
          }
          if ((((pTVar4->super_Symbol).kind == AssociativeArrayType) &&
              (pTVar4 = Type::getAssociativeIndexType(pTVar5), pTVar4 != (Type *)0x0)) &&
             (bVar3 = Type::isIntegral(pTVar4), !bVar3)) {
            if (args->size_ < 2) goto LAB_00399764;
            this_00 = ASTContext::addDiag(context,(DiagCode)0x1d000b,args->data_[1]->sourceRange);
            Diagnostic::operator<<
                      (this_00,&(this->super_SystemTaskBase).super_SystemSubroutine.name);
            goto LAB_00399734;
          }
          pTVar5 = Type::getArrayElementType(pTVar5);
          bVar3 = Type::isUnpackedArray(pTVar5);
        } while (bVar3);
        bVar3 = Type::isIntegral(pTVar5);
        uVar6 = args->size_;
        if (!bVar3) goto LAB_003996e1;
        if (uVar6 < 3) goto LAB_003996c7;
        pTVar5 = (args->data_[2]->type).ptr;
        if (pTVar5 != (Type *)0x0) {
          bVar3 = Type::isNumeric(pTVar5);
          if (!bVar3) {
            if (args->size_ < 3) goto LAB_00399764;
            arg = args->data_[2];
            goto LAB_003996ee;
          }
          if (args->size_ != 4) {
LAB_003996c7:
            return pCVar2->voidType;
          }
          pTVar5 = (args->data_[3]->type).ptr;
          if (pTVar5 != (Type *)0x0) {
            bVar3 = Type::isNumeric(pTVar5);
            if (!bVar3) {
              if (3 < args->size_) {
                arg = args->data_[3];
                goto LAB_003996ee;
              }
              goto LAB_00399764;
            }
            goto LAB_003996c7;
          }
        }
      }
    }
  }
  func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
LAB_00399795:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

SimpleSystemTask(const std::string& name, const Type& returnType, size_t requiredArgs = 0,
                     const std::vector<const Type*>& argTypes = {}) :
        SimpleSystemSubroutine(name, SubroutineKind::Task, requiredArgs, argTypes, returnType,
                               false) {}